

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::RelocateCallDirectToHelperPath
          (Lowerer *this,Instr *argoutInlineSpecialized,LabelInstr *labelHelper)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  RegOpnd *pRVar7;
  Opnd *this_00;
  
  this_00 = argoutInlineSpecialized->m_src2;
  IR::Instr::Unlink(argoutInlineSpecialized);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,argoutInlineSpecialized);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    bVar3 = IR::Opnd::IsSymOpnd(this_00);
    if (!bVar3) break;
    pSVar5 = IR::Opnd::AsSymOpnd(this_00);
    pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
    if ((pSVar6->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5237,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar3) goto LAB_0057da48;
      *puVar4 = 0;
    }
    pIVar1 = (pSVar6->field_5).m_instrDef;
    if (pIVar1->m_opcode != ArgOut_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5239,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                         "argInstr->m_opcode == Js::OpCode::ArgOut_A");
      if (!bVar3) goto LAB_0057da48;
      *puVar4 = 0;
    }
    IR::Instr::Unlink(pIVar1);
    IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar1);
    this_00 = pIVar1->m_src2;
  }
  bVar3 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5242,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar3) goto LAB_0057da48;
    *puVar4 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(this_00);
  pSVar6 = pRVar7->m_sym;
  if ((pSVar6->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5244,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar3) goto LAB_0057da48;
    *puVar4 = 0;
  }
  pIVar1 = (pSVar6->field_5).m_instrDef;
  if (pIVar1->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5246,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_0057da48:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  IR::Instr::Unlink(pIVar1);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar1);
  return;
}

Assistant:

void
Lowerer::RelocateCallDirectToHelperPath(IR::Instr* argoutInlineSpecialized, IR::LabelInstr* labelHelper)
{
    IR::Opnd *linkOpnd = argoutInlineSpecialized->GetSrc2(); //ArgOut_A_InlineSpecialized src2; link to actual argouts.

    argoutInlineSpecialized->Unlink();
    labelHelper->InsertAfter(argoutInlineSpecialized);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);
}